

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::IEEEFloat::convert
          (IEEEFloat *this,fltSemantics *toSemantics,roundingMode rounding_mode,bool *losesInfo)

{
  short sVar1;
  fltSemantics *pfVar2;
  uint uVar3;
  opStatus oVar4;
  WordType *dst;
  Significand *pSVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  Significand SVar9;
  uint parts;
  uint Count;
  bool bVar10;
  lostFraction local_44;
  
  pfVar2 = this->semantics;
  uVar8 = pfVar2->precision;
  Count = toSemantics->precision - uVar8;
  local_44 = lfExactlyZero;
  bVar10 = false;
  if (toSemantics != (fltSemantics *)semX87DoubleExtended &&
      pfVar2 == (fltSemantics *)semX87DoubleExtended) {
    if ((this->field_0x12 & 7) == 1) {
      if (uVar8 - 0x40 < 0xffffff80) {
        pSVar5 = (Significand *)(this->significand).parts;
      }
      else {
        pSVar5 = &this->significand;
      }
      bVar10 = (uint)(pSVar5->part >> 0x3e) < 3;
    }
    else {
      bVar10 = false;
    }
  }
  parts = toSemantics->precision + 0x40 >> 6;
  uVar8 = uVar8 + 0x40 >> 6;
  if ((int)Count < 0) {
    if ((this->field_0x12 & 7) != 3 && (this->field_0x12 & 6) != 0) {
      uVar3 = significandMSB(this);
      sVar1 = this->exponent;
      uVar6 = (int)toSemantics->minExponent - (int)sVar1;
      if ((int)toSemantics->minExponent <= (int)((uVar3 - pfVar2->precision) + (int)sVar1 + 1)) {
        uVar6 = (uVar3 - pfVar2->precision) + 1;
      }
      if ((int)uVar6 < 0) {
        if (uVar6 <= Count) {
          uVar6 = Count;
        }
        Count = Count - uVar6;
        this->exponent = sVar1 + (short)uVar6;
        if (-1 < (int)Count) goto LAB_0015be21;
      }
    }
    bVar7 = this->field_0x12 & 7;
    if ((bVar7 == 1) || ((this->field_0x12 & 6) != 0 && bVar7 != 3)) {
      if (this->semantics->precision - 0x40 < 0xffffff80) {
        pSVar5 = (Significand *)(this->significand).parts;
      }
      else {
        pSVar5 = &this->significand;
      }
      local_44 = shiftRight(&pSVar5->part,uVar8,-Count);
    }
  }
LAB_0015be21:
  if (uVar8 < parts) {
    dst = (WordType *)operator_new__((ulong)(parts * 8));
    APInt::tcSet(dst,0,parts);
    bVar7 = this->field_0x12 & 7;
    if ((bVar7 == 1) || ((this->field_0x12 & 6) != 0 && bVar7 != 3)) {
      if (this->semantics->precision - 0x40 < 0xffffff80) {
        pSVar5 = (Significand *)(this->significand).parts;
      }
      else {
        pSVar5 = &this->significand;
      }
      APInt::tcAssign(dst,&pSVar5->part,uVar8);
    }
    freeSignificand(this);
    (this->significand).parts = dst;
  }
  else if ((parts == 1) && (uVar8 != 1)) {
    bVar7 = this->field_0x12 & 7;
    if ((bVar7 == 1) || ((this->field_0x12 & 6) != 0 && bVar7 != 3)) {
      if (this->semantics->precision - 0x40 < 0xffffff80) {
        pSVar5 = (Significand *)(this->significand).parts;
      }
      else {
        pSVar5 = &this->significand;
      }
      SVar9 = *pSVar5;
    }
    else {
      SVar9.part = 0;
    }
    freeSignificand(this);
    (this->significand).part = (integerPart)SVar9;
  }
  this->semantics = toSemantics;
  if (0 < (int)Count) {
    bVar7 = this->field_0x12 & 7;
    if ((bVar7 == 1) || ((this->field_0x12 & 6) != 0 && bVar7 != 3)) {
      if (toSemantics->precision - 0x40 < 0xffffff80) {
        pSVar5 = (Significand *)(this->significand).parts;
      }
      else {
        pSVar5 = &this->significand;
      }
      APInt::tcShiftLeft(&pSVar5->part,parts,Count);
    }
  }
  bVar7 = this->field_0x12 & 7;
  if (bVar7 == 3 || (this->field_0x12 & 6) == 0) {
    if (bVar7 == 1) {
      *losesInfo = (bool)(local_44 != lfExactlyZero | bVar10);
      oVar4 = opOK;
      if (this->semantics == (fltSemantics *)semX87DoubleExtended && bVar10 == false) {
        APInt::tcSetBit((this->significand).parts,0x3f);
      }
    }
    else {
      *losesInfo = false;
      oVar4 = opOK;
    }
  }
  else {
    oVar4 = normalize(this,rounding_mode,local_44);
    *losesInfo = oVar4 != opOK;
  }
  return oVar4;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::convert(const fltSemantics &toSemantics,
                                       roundingMode rounding_mode,
                                       bool *losesInfo) {
  lostFraction lostFraction;
  unsigned int newPartCount, oldPartCount;
  opStatus fs;
  int shift;
  const fltSemantics &fromSemantics = *semantics;

  lostFraction = lfExactlyZero;
  newPartCount = partCountForBits(toSemantics.precision + 1);
  oldPartCount = partCount();
  shift = toSemantics.precision - fromSemantics.precision;

  bool X86SpecialNan = false;
  if (&fromSemantics == &semX87DoubleExtended &&
      &toSemantics != &semX87DoubleExtended && category == fcNaN &&
      (!(*significandParts() & 0x8000000000000000ULL) ||
       !(*significandParts() & 0x4000000000000000ULL))) {
    // x86 has some unusual NaNs which cannot be represented in any other
    // format; note them here.
    X86SpecialNan = true;
  }

  // If this is a truncation of a denormal number, and the target semantics
  // has larger exponent range than the source semantics (this can happen
  // when truncating from PowerPC double-double to double format), the
  // right shift could lose result mantissa bits.  Adjust exponent instead
  // of performing excessive shift.
  if (shift < 0 && isFiniteNonZero()) {
    int exponentChange = significandMSB() + 1 - fromSemantics.precision;
    if (exponent + exponentChange < toSemantics.minExponent)
      exponentChange = toSemantics.minExponent - exponent;
    if (exponentChange < shift)
      exponentChange = shift;
    if (exponentChange < 0) {
      shift -= exponentChange;
      exponent += exponentChange;
    }
  }

  // If this is a truncation, perform the shift before we narrow the storage.
  if (shift < 0 && (isFiniteNonZero() || category==fcNaN))
    lostFraction = shiftRight(significandParts(), oldPartCount, -shift);

  // Fix the storage so it can hold to new value.
  if (newPartCount > oldPartCount) {
    // The new type requires more storage; make it available.
    integerPart *newParts;
    newParts = new integerPart[newPartCount];
    APInt::tcSet(newParts, 0, newPartCount);
    if (isFiniteNonZero() || category==fcNaN)
      APInt::tcAssign(newParts, significandParts(), oldPartCount);
    freeSignificand();
    significand.parts = newParts;
  } else if (newPartCount == 1 && oldPartCount != 1) {
    // Switch to built-in storage for a single part.
    integerPart newPart = 0;
    if (isFiniteNonZero() || category==fcNaN)
      newPart = significandParts()[0];
    freeSignificand();
    significand.part = newPart;
  }

  // Now that we have the right storage, switch the semantics.
  semantics = &toSemantics;

  // If this is an extension, perform the shift now that the storage is
  // available.
  if (shift > 0 && (isFiniteNonZero() || category==fcNaN))
    APInt::tcShiftLeft(significandParts(), newPartCount, shift);

  if (isFiniteNonZero()) {
    fs = normalize(rounding_mode, lostFraction);
    *losesInfo = (fs != opOK);
  } else if (category == fcNaN) {
    *losesInfo = lostFraction != lfExactlyZero || X86SpecialNan;

    // For x87 extended precision, we want to make a NaN, not a special NaN if
    // the input wasn't special either.
    if (!X86SpecialNan && semantics == &semX87DoubleExtended)
      APInt::tcSetBit(significandParts(), semantics->precision - 1);

    // gcc forces the Quiet bit on, which means (float)(double)(float_sNan)
    // does not give you back the same bits.  This is dubious, and we
    // don't currently do it.  You're really supposed to get
    // an invalid operation signal at runtime, but nobody does that.
    fs = opOK;
  } else {
    *losesInfo = false;
    fs = opOK;
  }

  return fs;
}